

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O3

void __thiscall
OpenSteer::Camera::smoothCameraMove
          (Camera *this,Vec3 *newPosition,Vec3 *newTarget,Vec3 *newUp,float elapsedTime)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  undefined1 auVar7 [16];
  _func_int *UNRECOVERED_JUMPTABLE;
  float fVar8;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_XMM0 [16];
  float in_XMM1_Da;
  float fVar9;
  
  if (this->smoothNextMove == true) {
    fVar8 = elapsedTime * this->smoothMoveSpeed;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    fVar9 = 1.0;
    if (fVar8 <= 1.0) {
      fVar9 = fVar8;
    }
    fVar9 = (float)(~-(uint)(fVar8 < 0.0) & (uint)fVar9);
    fVar8 = newTarget->z;
    fVar1 = (this->target).z;
    uVar2 = newTarget->x;
    uVar5 = newTarget->y;
    uVar3 = (this->target).x;
    uVar6 = (this->target).y;
    (this->target).x = ((float)uVar2 - (float)uVar3) * fVar9 + (float)uVar3;
    (this->target).y = ((float)uVar5 - (float)uVar6) * fVar9 + (float)uVar6;
    (this->target).z = (fVar8 - fVar1) * fVar9 + fVar1;
    in_XMM1_Da = in_XMM1_Da + (newUp->z - in_XMM1_Da) * fVar9;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])(this);
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5])(this);
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    if (((float)extraout_XMM0_Qa == Vec3::zero.x) &&
       (!NAN((float)extraout_XMM0_Qa) && !NAN(Vec3::zero.x))) {
      fVar9 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
      if ((fVar9 == Vec3::zero.y) && (!NAN(fVar9) && !NAN(Vec3::zero.y))) {
        if ((in_XMM1_Da == Vec3::zero.z) && (!NAN(in_XMM1_Da) && !NAN(Vec3::zero.z)))
        goto LAB_0012f044;
      }
    }
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[4])(this);
    fVar9 = SQRT(in_XMM1_Da * in_XMM1_Da +
                 extraout_XMM0._0_4_ * extraout_XMM0._0_4_ +
                 extraout_XMM0._4_4_ * extraout_XMM0._4_4_);
    if (0.0 < fVar9) {
      auVar7._4_4_ = fVar9;
      auVar7._0_4_ = fVar9;
      auVar7._8_4_ = fVar9;
      auVar7._12_4_ = fVar9;
      divps(extraout_XMM0,auVar7);
    }
    UNRECOVERED_JUMPTABLE =
         (this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5];
  }
  else {
    this->smoothNextMove = true;
    uVar4._0_4_ = newPosition->x;
    uVar4._4_4_ = newPosition->y;
    (*(this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])
              (uVar4,newPosition->z,this);
    fVar9 = newTarget->y;
    (this->target).x = newTarget->x;
    (this->target).y = fVar9;
    (this->target).z = newTarget->z;
LAB_0012f044:
    UNRECOVERED_JUMPTABLE =
         (this->super_LocalSpace).super_AbstractLocalSpace._vptr_AbstractLocalSpace[5];
  }
  (*UNRECOVERED_JUMPTABLE)(this);
  return;
}

Assistant:

void 
OpenSteer::Camera::smoothCameraMove (const Vec3& newPosition,
                                     const Vec3& newTarget,
                                     const Vec3& newUp,
                                     const float elapsedTime)
{
    if (smoothNextMove)
    {
        const float smoothRate = elapsedTime * smoothMoveSpeed;

        Vec3 tempPosition = position();
        Vec3 tempUp = up();
        blendIntoAccumulator (smoothRate, newPosition, tempPosition);
        blendIntoAccumulator (smoothRate, newTarget,   target);
        blendIntoAccumulator (smoothRate, newUp,       tempUp);
        setPosition (tempPosition);
        setUp (tempUp);

        // xxx not sure if these are needed, seems like a good idea
        // xxx (also if either up or oldUP are zero, use the other?)
        // xxx (even better: force up to be perp to target-position axis))
        if (up() == Vec3::zero)
            setUp (Vec3::up);
        else
            setUp (up().normalize ());
    }
    else
    {
        smoothNextMove = true;

        setPosition (newPosition);
        target   = newTarget;
        setUp (newUp);
    }
}